

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileIO.cpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> *
read_binary_file(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
                string *filename)

{
  FILE *__stream;
  size_type __new_size;
  size_t sVar1;
  runtime_error *prVar2;
  long *plVar3;
  long *plVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  __stream = fopen((filename->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&bStack_68,"File ",filename);
    plVar3 = (long *)std::__cxx11::string::append((char *)&bStack_68);
    local_48 = (long *)*plVar3;
    plVar4 = plVar3 + 2;
    if (local_48 == plVar4) {
      local_38 = *plVar4;
      lStack_30 = plVar3[3];
      local_48 = &local_38;
    }
    else {
      local_38 = *plVar4;
    }
    local_40 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::runtime_error::runtime_error(prVar2,(string *)&local_48);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  fseek(__stream,0,2);
  __new_size = ftell(__stream);
  rewind(__stream);
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (__return_storage_ptr__,__new_size);
  sVar1 = fread((__return_storage_ptr__->
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start,__new_size,1,__stream);
  if (sVar1 == 1) {
    return __return_storage_ptr__;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_68,"File ",filename);
  plVar3 = (long *)std::__cxx11::string::append((char *)&bStack_68);
  local_48 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_48 == plVar4) {
    local_38 = *plVar4;
    lStack_30 = plVar3[3];
    local_48 = &local_38;
  }
  else {
    local_38 = *plVar4;
  }
  local_40 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error(prVar2,(string *)&local_48);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<uint8_t> read_binary_file(const std::string& filename) {
  auto fp = fopen(filename.c_str(), "rb");
  if(!fp) throw std::runtime_error("File " + filename + " cannot be opened");
  fseek(fp, 0, SEEK_END);
  auto len = ftell(fp);
  rewind(fp);

  std::vector<uint8_t> data;
  data.resize(len);

  if(fread(data.data(), len, 1, fp) != 1) {
    throw std::runtime_error("File " + filename + " cannot be read");
  }

  return data;
}